

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxil.c
# Opt level: O0

void compute_rhs(OSQPWorkspace *work)

{
  c_int i;
  OSQPWorkspace *work_local;
  
  for (i = 0; i < work->data->n; i = i + 1) {
    work->xz_tilde[i] = work->settings->sigma * work->x_prev[i] + -work->data->q[i];
  }
  for (i = 0; i < work->data->m; i = i + 1) {
    work->xz_tilde[i + work->data->n] = -work->rho_inv_vec[i] * work->y[i] + work->z_prev[i];
  }
  return;
}

Assistant:

static void compute_rhs(OSQPWorkspace *work) {
  c_int i; // Index

  for (i = 0; i < work->data->n; i++) {
    // Cycle over part related to x variables
    work->xz_tilde[i] = work->settings->sigma * work->x_prev[i] -
                        work->data->q[i];
  }

  for (i = 0; i < work->data->m; i++) {
    // Cycle over dual variable in the first step (nu)
    work->xz_tilde[i + work->data->n] = work->z_prev[i] - work->rho_inv_vec[i] *
                                        work->y[i];
  }
}